

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsConvert::flushMinimize(SmodelsConvert *this)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  long in_RDI;
  Span<Potassco::WeightLit_t> SVar4;
  iterator end;
  iterator it;
  map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *c;
  Span<Potassco::WeightLit_t> in_stack_ffffffffffffffd8;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar2 = std::operator!=(local_10,&local_18);
    if (!bVar2) break;
    c = *(vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> **)(in_RDI + 8);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>
                           *)0x11d6ff);
    iVar1 = ppVar3->first;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>
                  *)0x11d71f);
    SVar4 = toSpan<std::vector<Potassco::WeightLit_t,std::allocator<Potassco::WeightLit_t>>>(c);
    in_stack_ffffffffffffffd8 =
         SmData::mapLits<Potassco::WeightLit_t>
                   ((SmData *)in_stack_ffffffffffffffd8.size,
                    (Span<Potassco::WeightLit_t> *)in_stack_ffffffffffffffd8.first,
                    (vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                    SVar4.size);
    (*(code *)(c->super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>)
              ._M_impl.super__Vector_impl_data._M_start[6])(c,iVar1,&stack0xffffffffffffffd8);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>
                  *)c);
  }
  return;
}

Assistant:

void SmodelsConvert::flushMinimize() {
	for (SmData::MinMap::iterator it = data_->minimize_.begin(), end = data_->minimize_.end(); it != end; ++it) {
		out_.minimize(it->first, data_->mapLits(toSpan(it->second), data_->wlits_));
	}
}